

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O0

_Bool check_arguments(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,
                     inform_error *err)

{
  size_t sVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong local_80;
  size_t j;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  double bits;
  size_t i_1;
  size_t i;
  size_t *r_local;
  int *b_local;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *series_local;
  
  if (series == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local._7_1_ = true;
  }
  else if (l == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
    series_local._7_1_ = true;
  }
  else if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOINITS;
    }
    series_local._7_1_ = true;
  }
  else if (m == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
    }
    series_local._7_1_ = true;
  }
  else if (b == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EBASE;
    }
    series_local._7_1_ = true;
  }
  else {
    if (r != (size_t *)0x0) {
      if (s == (size_t *)0x0) {
        for (bits = 0.0; (ulong)bits < l; bits = (double)((long)bits + 1)) {
          if (r[(long)bits] == 0) {
            if (err != (inform_error *)0x0) {
              *err = INFORM_EKZERO;
            }
            return true;
          }
          if (m < r[(long)bits]) {
            if (err != (inform_error *)0x0) {
              *err = INFORM_EKLONG;
            }
            return true;
          }
        }
      }
      else {
        for (i_1 = 0; i_1 < l; i_1 = i_1 + 1) {
          if ((r[i_1] == 0) && (s[i_1] == 0)) {
            if (err != (inform_error *)0x0) {
              *err = INFORM_EKZERO;
            }
            return true;
          }
          if (m < r[i_1] + s[i_1]) {
            if (err != (inform_error *)0x0) {
              *err = INFORM_EKLONG;
            }
            return true;
          }
        }
      }
    }
    i_2 = 0;
    if (r == (size_t *)0x0) {
      for (i_4 = 0; i_4 < l; i_4 = i_4 + 1) {
        if (b[i_4] < 2) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_EBASE;
          }
          return true;
        }
        dVar2 = log2((double)b[i_4]);
        i_2 = (size_t)(dVar2 + (double)i_2);
      }
    }
    else {
      for (i_3 = 0; i_3 < l; i_3 = i_3 + 1) {
        if (b[i_3] < 2) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_EBASE;
          }
          return true;
        }
        sVar1 = r[i_3];
        auVar3._8_4_ = (int)(sVar1 >> 0x20);
        auVar3._0_8_ = sVar1;
        auVar3._12_4_ = 0x45300000;
        dVar2 = log2((double)b[i_3]);
        i_2 = (size_t)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * dVar2 +
                      (double)i_2);
      }
    }
    if (s != (size_t *)0x0) {
      for (i_5 = 0; i_5 < l; i_5 = i_5 + 1) {
        sVar1 = s[i_5];
        auVar4._8_4_ = (int)(sVar1 >> 0x20);
        auVar4._0_8_ = sVar1;
        auVar4._12_4_ = 0x45300000;
        dVar2 = log2((double)b[i_5]);
        i_2 = (size_t)(((auVar4._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * dVar2 +
                      (double)i_2);
      }
    }
    if ((double)i_2 <= 30.0) {
      for (j = 0; j < l; j = j + 1) {
        for (local_80 = 0; local_80 < n * m; local_80 = local_80 + 1) {
          if (series[n * m * j + local_80] < 0) {
            if (err != (inform_error *)0x0) {
              *err = INFORM_ENEGSTATE;
            }
            return true;
          }
          if (b[j] <= series[n * m * j + local_80]) {
            if (err != (inform_error *)0x0) {
              *err = INFORM_EBADSTATE;
            }
            return true;
          }
        }
      }
      series_local._7_1_ = false;
    }
    else {
      if (err != (inform_error *)0x0) {
        *err = INFORM_EENCODE;
      }
      series_local._7_1_ = true;
    }
  }
  return series_local._7_1_;
}

Assistant:

static bool check_arguments(int const *series, size_t l, size_t n, size_t m,
    int const *b, size_t const *r, size_t const *s, inform_error *err)
{

    if (series == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, true);
    }
    else if (l == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, true);
    }
    else if (n == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOINITS, true);
    }
    else if (m == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, true);
    }
    else if (b == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
    }
    else if (r != NULL)
    {
        if (s != NULL)
        {
            for (size_t i = 0; i < l; ++i)
            {
                if (r[i] == 0 && s[i] == 0)
                    INFORM_ERROR_RETURN(err, INFORM_EKZERO, true);
                if (r[i] + s[i] > m)
                    INFORM_ERROR_RETURN(err, INFORM_EKLONG, true);
            }
        }
        else
        {
            for (size_t i = 0; i < l; ++i)
            {
                if (r[i] == 0)
                    INFORM_ERROR_RETURN(err, INFORM_EKZERO, true);
                if (r[i] > m)
                    INFORM_ERROR_RETURN(err, INFORM_EKLONG, true);
            }
        }
    }
    double bits = 0.0;
    if (r != NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            if (b[i] < 2)
            {
                INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
            }
            bits += r[i] * log2(b[i]);
        }
    }
    else
    {
        for (size_t i = 0; i < l; ++i)
        {
            if (b[i] < 2)
            {
                INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
            }
            bits += log2(b[i]);
        }
    }
    if (s != NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            bits += s[i] * log2(b[i]);
        }
    }
    if (bits > 30.0)
    {
        INFORM_ERROR_RETURN(err, INFORM_EENCODE, true);
    }
    for (size_t i = 0; i < l; ++i)
    {
        for (size_t j = 0; j < n * m; ++j)
        {
            if (series[n*m*i + j] < 0)
            {
                INFORM_ERROR_RETURN(err, INFORM_ENEGSTATE, true);
            }
            else if (series[n*m*i + j] >= b[i])
            {
                INFORM_ERROR_RETURN(err, INFORM_EBADSTATE, true);
            }
        }
    }

    return false;
}